

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void ctemplate::AppendTokenWithIndent
               (int level,string *out,string *before,TemplateToken *token,string *after)

{
  string token_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  token_string._M_dataplus._M_p = (pointer)&token_string.field_2;
  std::__cxx11::string::_M_construct((ulong)&token_string,(char)level * '\x02');
  std::__cxx11::string::append((string *)out);
  std::__cxx11::string::~string((string *)&token_string);
  token_string._M_dataplus._M_p = (pointer)&token_string.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&token_string,token->text,token->text + token->textlen);
  std::operator+(&local_70,before,&token_string);
  std::operator+(&local_50,&local_70,after);
  std::__cxx11::string::append((string *)out);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&token_string);
  return;
}

Assistant:

static void AppendTokenWithIndent(int level, string *out, const string& before,
                                  const TemplateToken& token,
                                  const string& after) {
  out->append(string(level * kIndent, ' '));
  string token_string(token.text, token.textlen);
  out->append(before + token_string + after);
}